

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float text_baseline_y;
  ImGuiNextWindowDataFlags IVar1;
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 IVar2;
  ImVec2 p_min;
  ImVec2 IVar3;
  ImVec2 p_max;
  ImGuiContext_conflict1 *pIVar4;
  char *text;
  _Bool _Var5;
  bool bVar6;
  ImGuiID id;
  ImU32 IVar7;
  ImU32 IVar8;
  ImDrawFlags IVar9;
  ImGuiContext *g;
  uint uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar11;
  float fVar12;
  bool hovered;
  bool held;
  ImRect bb;
  ImRect total_bb;
  bool local_d9;
  float local_d8;
  bool local_d1;
  ImRect local_d0;
  ImGuiID local_bc;
  undefined1 local_b8 [16];
  ImGuiNextWindowDataFlags local_a4;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  char *local_78;
  char *local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar4 = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  this->WriteAccessed = true;
  IVar1 = (pIVar4->NextWindowData).Flags;
  (pIVar4->NextWindowData).Flags = 0;
  if (this->SkipItems == false) {
    local_70 = preview_value;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    if ((~flags & 0x60U) == 0) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x62a,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    local_d8 = 0.0;
    if ((flags & 0x20U) == 0) {
      local_d8 = GetFrameHeight();
    }
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_98._8_4_ = extraout_XMM0_Dc;
    local_98._0_4_ = IVar2.x;
    local_98._4_4_ = IVar2.y;
    local_98._12_4_ = extraout_XMM0_Dd;
    local_68 = local_d8;
    fVar11 = IVar2.x;
    fVar12 = IVar2.y;
    if ((flags & 0x40U) == 0) {
      local_68 = CalcItemWidth();
      uStack_64 = extraout_XMM0_Db;
      uStack_60 = extraout_XMM0_Dc_00;
      uStack_5c = extraout_XMM0_Dd_00;
      fVar11 = (float)local_98._0_4_;
      fVar12 = (float)local_98._4_4_;
    }
    text_baseline_y = (pIVar4->Style).FramePadding.y;
    local_d0.Min.x = (this->DC).CursorPos.x;
    local_d0.Min.y = (this->DC).CursorPos.y;
    local_d0.Max.x = local_68 + local_d0.Min.x;
    local_d0.Max.y = text_baseline_y + text_baseline_y + fVar12 + local_d0.Min.y;
    local_40.Max.x = 0.0;
    if (0.0 < fVar11) {
      local_40.Max.x = (pIVar4->Style).ItemInnerSpacing.x + fVar11;
    }
    local_40.Max.x = local_40.Max.x + local_d0.Max.x;
    local_40.Max.y = local_d0.Max.y + 0.0;
    local_a4 = IVar1;
    local_78 = label;
    local_40.Min.x = local_d0.Min.x;
    local_40.Min.y = local_d0.Min.y;
    ItemSize(&local_40,text_baseline_y);
    _Var5 = ItemAdd(&local_40,id,&local_d0,0);
    if (!_Var5) {
      return false;
    }
    bVar6 = ButtonBehavior(&local_d0,id,&local_d9,&local_d1,0);
    local_bc = ImHashStr("##ComboPopup",0,id);
    _Var5 = IsPopupOpen(local_bc,0);
    if ((!_Var5) && (bVar6)) {
      OpenPopupEx(local_bc,0);
      _Var5 = true;
    }
    IVar7 = GetColorU32(local_d9 + 7,1.0);
    local_b8 = ZEXT416((uint)local_d0.Min.x);
    local_88 = ZEXT416((uint)local_d0.Max.x);
    RenderNavHighlight(&local_d0,id,1);
    uVar10 = -(uint)((float)local_88._0_4_ - local_d8 <= (float)local_b8._0_4_);
    local_b8._0_4_ = uVar10 & local_b8._0_4_ | ~uVar10 & (uint)((float)local_88._0_4_ - local_d8);
    local_b8._4_4_ = local_88._4_4_ & local_b8._4_4_;
    local_b8._8_4_ = local_88._8_4_ & local_b8._8_4_;
    local_b8._12_4_ = local_88._12_4_ & local_b8._12_4_;
    if ((flags & 0x40U) == 0) {
      local_a0.y = local_d0.Max.y;
      local_a0.x = (float)local_b8._0_4_;
      IVar9 = 0xf0;
      if ((flags & 0x20U) == 0) {
        IVar9 = 0x50;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_d0.Min,&local_a0,IVar7,(pIVar4->Style).FrameRounding,IVar9);
    }
    if ((flags & 0x20U) == 0) {
      IVar7 = GetColorU32(((byte)(local_d9 | _Var5) & 1) + 0x15,1.0);
      IVar8 = GetColorU32(0,1.0);
      local_88._0_4_ = IVar8;
      local_a0.y = local_d0.Min.y;
      local_a0.x = (float)local_b8._0_4_;
      IVar9 = 0xa0;
      if (local_68 <= local_d8) {
        IVar9 = 0xf0;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_a0,&local_d0.Max,IVar7,(pIVar4->Style).FrameRounding,IVar9);
      if (((float)local_b8._0_4_ + local_d8) - (pIVar4->Style).FramePadding.x <= local_d0.Max.x) {
        fVar11 = (pIVar4->Style).FramePadding.y;
        IVar2.y = fVar11 + local_d0.Min.y;
        IVar2.x = fVar11 + (float)local_b8._0_4_;
        RenderArrow(this->DrawList,IVar2,local_88._0_4_,3,1.0);
      }
    }
    p_min.y = local_d0.Min.y;
    p_min.x = local_d0.Min.x;
    p_max.y = local_d0.Max.y;
    p_max.x = local_d0.Max.x;
    RenderFrameBorder(p_min,p_max,(pIVar4->Style).FrameRounding);
    text = local_70;
    if (((uint)flags >> 0x14 & 1) == 0) {
      if (local_70 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
        if (pIVar4->LogEnabled == true) {
          LogSetNextTextDecoration("{","}");
        }
        IVar2 = (pIVar4->Style).FramePadding;
        local_a0.x = IVar2.x + local_d0.Min.x;
        local_a0.y = IVar2.y + local_d0.Min.y;
        local_48.x = (float)local_b8._0_4_;
        local_48.y = local_d0.Max.y;
        local_50.x = 0.0;
        local_50.y = 0.0;
        RenderTextClipped(&local_a0,&local_48,text,(char *)0x0,(ImVec2 *)0x0,&local_50,(ImRect *)0x0
                         );
      }
    }
    else {
      IVar3.y = local_d0.Min.y;
      IVar3.x = local_d0.Min.x;
      (pIVar4->ComboPreviewData).PreviewRect.Min = IVar3;
      (pIVar4->ComboPreviewData).PreviewRect.Max.x = (float)local_b8._0_4_;
      (pIVar4->ComboPreviewData).PreviewRect.Max.y = local_d0.Max.y;
      if ((local_70 != (char *)0x0) && (*local_70 != '\0')) {
        __assert_fail("preview_value == __null || preview_value[0] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                      ,0x654,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
      }
    }
    if (0.0 < (float)local_98._0_4_) {
      pos.y = (pIVar4->Style).FramePadding.y + local_d0.Min.y;
      pos.x = (pIVar4->Style).ItemInnerSpacing.x + local_d0.Max.x;
      RenderText(pos,local_78,(char *)0x0,true);
    }
    if (_Var5 != false) {
      (pIVar4->NextWindowData).Flags = local_a4;
      bVar6 = BeginComboPopup(local_bc,&local_d0,flags);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if (pressed && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Custom preview
    if (flags & ImGuiComboFlags_CustomPreview)
    {
        g.ComboPreviewData.PreviewRect = ImRect(bb.Min.x, bb.Min.y, value_x2, bb.Max.y);
        IM_ASSERT(preview_value == NULL || preview_value[0] == 0);
        preview_value = NULL;
    }

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}